

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O0

void __thiscall Future<void>::startProc(Future<void> *this,_func_void_void_ptr *proc,void *args)

{
  int32 iVar1;
  uint uVar2;
  ThreadPool *local_28;
  ThreadPool *threadPool;
  void *args_local;
  _func_void_void_ptr *proc_local;
  Future<void> *this_local;
  
  local_28 = Private::_threadPool;
  if (Private::_threadPool == (ThreadPool *)0x0) {
    do {
      iVar1 = Atomic::testAndSet(&Private::_threadPoolLock);
    } while (iVar1 != 0);
    local_28 = Private::_threadPool;
    if (Private::_threadPool == (ThreadPool *)0x0) {
      local_28 = (ThreadPool *)operator_new(0x248);
      uVar2 = System::getProcessorCount();
      Private::ThreadPool::ThreadPool(local_28,0,(ulong)uVar2,0x100);
      Atomic::swap<Future<void>::Private::ThreadPool>(&Private::_threadPool,local_28);
    }
    Private::_threadPoolLock = 0;
  }
  join(this);
  this->_joinable = true;
  this->_aborting = false;
  Private::ThreadPool::run(local_28,proc,args);
  return;
}

Assistant:

void Future<void>::startProc(void (*proc)(void *), void *args)
{
  Private::ThreadPool *threadPool = Private::_threadPool;
  if (!threadPool)
  {
    while (Atomic::testAndSet(Private::_threadPoolLock) != 0)
      ;
    if (!(threadPool = Private::_threadPool))
    {
      threadPool = new Private::ThreadPool;
      Atomic::swap(Private::_threadPool, threadPool);
    }
    Private::_threadPoolLock = 0;
  }

  join();
  _joinable = true;
  _aborting = false;
  threadPool->run(proc, args);
}